

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O2

void __thiscall Catch::TestRunStats::~TestRunStats(TestRunStats *this)

{
  ~TestRunStats(this);
  operator_delete(this);
  return;
}

Assistant:

TestRunStats::~TestRunStats() {}